

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsWindowFocused(ImGuiFocusedFlags flags)

{
  uint uVar1;
  bool local_1e;
  bool local_1d;
  ImGuiContext *g;
  ImGuiFocusedFlags flags_local;
  
  if ((flags & 4U) == 0) {
    if (GImGui->CurrentWindow == (ImGuiWindow *)0x0) {
      __assert_fail("g.CurrentWindow",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x1b89,"bool ImGui::IsWindowFocused(ImGuiFocusedFlags)");
    }
    uVar1 = flags & 3;
    if (uVar1 == 1) {
      local_1e = false;
      if (GImGui->NavWindow != (ImGuiWindow *)0x0) {
        local_1e = IsWindowChildOf(GImGui->NavWindow,GImGui->CurrentWindow);
      }
      g._7_1_ = local_1e;
    }
    else if (uVar1 == 2) {
      g._7_1_ = GImGui->NavWindow == GImGui->CurrentWindow->RootWindowDockStop;
    }
    else if (uVar1 == 3) {
      local_1d = false;
      if (GImGui->NavWindow != (ImGuiWindow *)0x0) {
        local_1d = GImGui->NavWindow->RootWindowDockStop ==
                   GImGui->CurrentWindow->RootWindowDockStop;
      }
      g._7_1_ = local_1d;
    }
    else {
      g._7_1_ = GImGui->NavWindow == GImGui->CurrentWindow;
    }
  }
  else {
    g._7_1_ = GImGui->NavWindow != (ImGuiWindow *)0x0;
  }
  return g._7_1_;
}

Assistant:

bool ImGui::IsWindowFocused(ImGuiFocusedFlags flags)
{
    ImGuiContext& g = *GImGui;

    if (flags & ImGuiFocusedFlags_AnyWindow)
        return g.NavWindow != NULL;

    IM_ASSERT(g.CurrentWindow);     // Not inside a Begin()/End()
    switch (flags & (ImGuiFocusedFlags_RootWindow | ImGuiFocusedFlags_ChildWindows))
    {
    case ImGuiFocusedFlags_RootWindow | ImGuiFocusedFlags_ChildWindows:
        return g.NavWindow && g.NavWindow->RootWindowDockStop == g.CurrentWindow->RootWindowDockStop;
    case ImGuiFocusedFlags_RootWindow:
        return g.NavWindow == g.CurrentWindow->RootWindowDockStop;
    case ImGuiFocusedFlags_ChildWindows:
        return g.NavWindow && IsWindowChildOf(g.NavWindow, g.CurrentWindow);
    default:
        return g.NavWindow == g.CurrentWindow;
    }
}